

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

int Abc_FlowRetime_PushFlows(Abc_Ntk_t *pNtk,int fVerbose)

{
  ushort uVar1;
  void *pvVar2;
  Abc_Obj_t *pObj;
  bool bVar3;
  ushort uVar4;
  MinRegMan_t *pMVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  ushort uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  
  pMVar5 = pManMR;
  pManMR->constraintMask = pManMR->constraintMask | 0x10;
  pMVar5->fSinkDistTerminate = 0;
  dfsfast_preorder(pNtk);
  uVar12 = 0;
  if (pManMR->fSinkDistTerminate == 0) {
    uVar12 = 0;
    do {
      lVar8 = (long)pNtk->vBoxes->nSize;
      if (lVar8 < 1) {
        uVar9 = 30000;
      }
      else {
        uVar9 = 30000;
        lVar11 = 0;
        do {
          pvVar2 = pNtk->vBoxes->pArray[lVar11];
          if ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 8) {
            uVar1 = *(ushort *)&pManMR->pDataArray[*(uint *)((long)pvVar2 + 0x10)].field_0x10;
            uVar4 = uVar1;
            if (uVar9 < uVar1) {
              uVar4 = uVar9;
            }
            if (uVar1 != 0) {
              uVar9 = uVar4;
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar8 != lVar11);
      }
      pVVar7 = pNtk->vBoxes;
      if (0 < pVVar7->nSize) {
        lVar8 = 0;
        do {
          pObj = (Abc_Obj_t *)pVVar7->pArray[lVar8];
          if (((*(uint *)&pObj->field_0x14 & 0xf) == 8) &&
             (uVar9 == *(ushort *)&pManMR->pDataArray[(uint)pObj->Id].field_0x10)) {
            iVar6 = dfsfast_e(pObj,(Abc_Obj_t *)0x0);
            uVar12 = (uVar12 + 1) - (uint)(iVar6 == 0);
          }
          lVar8 = lVar8 + 1;
          pVVar7 = pNtk->vBoxes;
        } while (lVar8 < pVVar7->nSize);
      }
    } while ((pManMR->fSinkDistTerminate == 0) && (uVar9 < 30000));
  }
  if ((fVerbose != 0) && (pManMR->fVerbose != 0)) {
    printf("\t\tmax-flow1 = %d \t");
  }
  do {
    pVVar7 = pNtk->vBoxes;
    uVar10 = uVar12;
    if (0 < pVVar7->nSize) {
      lVar8 = 0;
      do {
        if (((*(uint *)&((Abc_Obj_t *)pVVar7->pArray[lVar8])->field_0x14 & 0xf) == 8) &&
           (iVar6 = dfsplain_e((Abc_Obj_t *)pVVar7->pArray[lVar8],(Abc_Obj_t *)0x0), iVar6 != 0)) {
          uVar10 = uVar10 + 1;
          pVVar7 = pNtk->vObjs;
          if (0 < pVVar7->nSize) {
            lVar11 = 0;
            do {
              if (pVVar7->pArray[lVar11] != (void *)0x0) {
                *(ushort *)(pManMR->pDataArray + *(uint *)((long)pVVar7->pArray[lVar11] + 0x10)) =
                     *(ushort *)
                      (pManMR->pDataArray + *(uint *)((long)pVVar7->pArray[lVar11] + 0x10)) & 0xfffc
                ;
              }
              lVar11 = lVar11 + 1;
              pVVar7 = pNtk->vObjs;
            } while (lVar11 < pVVar7->nSize);
          }
        }
        lVar8 = lVar8 + 1;
        pVVar7 = pNtk->vBoxes;
      } while (lVar8 < pVVar7->nSize);
    }
    bVar3 = (int)uVar12 < (int)uVar10;
    uVar12 = uVar10;
  } while (bVar3);
  if ((fVerbose != 0) && (pManMR->fVerbose != 0)) {
    printf("max-flow2 = %d\n",(ulong)uVar10);
  }
  return uVar10;
}

Assistant:

int
Abc_FlowRetime_PushFlows( Abc_Ntk_t * pNtk, int fVerbose ) {
  int i, j, flow = 0, last, srcDist = 0;
  Abc_Obj_t   *pObj, *pObj2;
//  int clk = clock();

  pManMR->constraintMask |= BLOCK;

  pManMR->fSinkDistTerminate = 0;
  dfsfast_preorder( pNtk );

  // (i) fast max-flow computation
  while(!pManMR->fSinkDistTerminate && srcDist < MAX_DIST) {
    srcDist = MAX_DIST;
    Abc_NtkForEachLatch( pNtk, pObj, i )
      if (FDATA(pObj)->e_dist)    
        srcDist = MIN(srcDist, (int)FDATA(pObj)->e_dist);
    
    Abc_NtkForEachLatch( pNtk, pObj, i ) {
      if (srcDist == (int)FDATA(pObj)->e_dist &&
          dfsfast_e( pObj, NULL )) {
#ifdef DEBUG_PRINT_FLOWS
        printf("\n\n");
#endif
        flow++;
      }
    }
  }

  if (fVerbose) vprintf("\t\tmax-flow1 = %d \t", flow);

  // (ii) complete max-flow computation
  // also, marks source-reachable nodes
  do {
    last = flow;
    Abc_NtkForEachLatch( pNtk, pObj, i ) {
      if (dfsplain_e( pObj, NULL )) {
#ifdef DEBUG_PRINT_FLOWS
        printf("\n\n");
#endif
        flow++;
        Abc_NtkForEachObj( pNtk, pObj2, j )
          FUNSET( pObj2, VISITED );
      }
    }
  } while (flow > last);
  
  if (fVerbose) vprintf("max-flow2 = %d\n", flow);

//  PRT( "time", clock() - clk );
  return flow;
}